

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,unsigned_long value,
          basic_format_specs<char> *specs)

{
  size_t sVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  char *pcVar5;
  unsigned_long uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar7 = 2;
  uVar6 = value;
  do {
    uVar7 = uVar7 + 1;
    bVar2 = 0xf < uVar6;
    uVar6 = uVar6 >> 4;
  } while (bVar2);
  if (specs == (basic_format_specs<char> *)0x0) {
    sVar1 = (out.container)->size_;
    uVar3 = sVar1 + uVar7;
    if ((out.container)->capacity_ < uVar3) {
      (**(out.container)->_vptr_buffer)(out.container,uVar3);
    }
    (out.container)->size_ = uVar3;
    pcVar5 = (out.container)->ptr_;
    pcVar4 = pcVar5 + sVar1;
    pcVar4[0] = '0';
    pcVar4[1] = 'x';
    pcVar5 = pcVar5 + uVar7 + sVar1;
    do {
      pcVar5 = pcVar5 + -1;
      *pcVar5 = "0123456789abcdef"[(uint)value & 0xf];
      bVar2 = 0xf < value;
      value = value >> 4;
    } while (bVar2);
  }
  else {
    uVar3 = (ulong)specs->width;
    if ((long)uVar3 < 0) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/core.h"
                  ,0x13d,"negative value");
    }
    uVar9 = 0;
    if (uVar7 <= uVar3) {
      uVar9 = uVar3 - uVar7;
    }
    uVar3 = uVar9 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar1 = (out.container)->size_;
    uVar8 = (specs->fill).size_ * uVar9 + sVar1 + uVar7;
    if ((out.container)->capacity_ < uVar8) {
      (**(out.container)->_vptr_buffer)(out.container,uVar8);
    }
    (out.container)->size_ = uVar8;
    pcVar4 = fill<char*,char>((out.container)->ptr_ + sVar1,uVar3,&specs->fill);
    pcVar4[0] = '0';
    pcVar4[1] = 'x';
    pcVar5 = pcVar4 + uVar7;
    do {
      pcVar5 = pcVar5 + -1;
      *pcVar5 = "0123456789abcdef"[(uint)value & 0xf];
      bVar2 = 0xf < value;
      value = value >> 4;
    } while (bVar2);
    fill<char*,char>(pcVar4 + uVar7,uVar9 - uVar3,&specs->fill);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out.container;
}

Assistant:

OutputIt write_ptr(OutputIt out, UIntPtr value,
                   const basic_format_specs<Char>* specs) {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  auto write = [=](iterator it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}